

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O0

int create_and_put_SAS_token_to_cbs(AUTHENTICATION_INSTANCE_conflict *instance)

{
  IOTHUB_AUTHORIZATION_HANDLE handle;
  IOTHUB_CREDENTIAL_TYPE IVar1;
  int iVar2;
  STRING_HANDLE handle_00;
  LOGGER_LOG p_Var3;
  char *scope;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  IOTHUB_CREDENTIAL_TYPE cred_type;
  LOGGER_LOG l;
  STRING_HANDLE device_and_module_path;
  char *sas_token;
  int result;
  AUTHENTICATION_INSTANCE_conflict *instance_local;
  
  handle_00 = create_device_and_module_path
                        (instance->iothub_host_fqdn,instance->device_id,instance->module_id);
  if (handle_00 == (STRING_HANDLE)0x0) {
    sas_token._4_4_ = 0xf8;
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                ,"create_and_put_SAS_token_to_cbs",0xfa,1,
                "Failed creating a SAS token (create_device_and_module_path() failed)");
    }
  }
  else {
    IVar1 = IoTHubClient_Auth_Get_Credential_Type(instance->authorization_module);
    if ((IVar1 == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) ||
       (IVar1 == IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH)) {
      handle = instance->authorization_module;
      scope = STRING_c_str(handle_00);
      device_and_module_path =
           (STRING_HANDLE)IoTHubClient_Auth_Get_SasToken(handle,scope,0,(char *)0x0);
      if (device_and_module_path == (STRING_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                    ,"create_and_put_SAS_token_to_cbs",0x104,1,"failure getting sas token.");
        }
        sas_token._4_4_ = 0x105;
      }
      else {
        sas_token._4_4_ = 0;
      }
    }
    else if (IVar1 == IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN) {
      device_and_module_path =
           (STRING_HANDLE)
           IoTHubClient_Auth_Get_SasToken(instance->authorization_module,(char *)0x0,0,(char *)0x0);
      if (device_and_module_path == (STRING_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                    ,"create_and_put_SAS_token_to_cbs",0x111,1,"Failure getting SAS token.");
        }
        sas_token._4_4_ = 0x112;
      }
      else {
        sas_token._4_4_ = 0;
      }
    }
    else {
      if ((IVar1 == IOTHUB_CREDENTIAL_TYPE_X509) || (IVar1 == IOTHUB_CREDENTIAL_TYPE_X509_ECC)) {
        sas_token._4_4_ = 0;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                    ,"create_and_put_SAS_token_to_cbs",0x120,1,
                    "failure unknown credential type found.");
        }
        sas_token._4_4_ = 0x122;
      }
      device_and_module_path = (STRING_HANDLE)0x0;
    }
    if (device_and_module_path != (STRING_HANDLE)0x0) {
      iVar2 = put_SAS_token_to_cbs(instance,handle_00,(char *)device_and_module_path);
      if (iVar2 == 0) {
        sas_token._4_4_ = 0;
      }
      else {
        sas_token._4_4_ = 0x12a;
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                    ,"create_and_put_SAS_token_to_cbs",299,1,"Failed putting SAS token to CBS");
        }
      }
      free(device_and_module_path);
    }
    STRING_delete(handle_00);
  }
  return sas_token._4_4_;
}

Assistant:

static int create_and_put_SAS_token_to_cbs(AUTHENTICATION_INSTANCE* instance)
{
    int result;
    char* sas_token;
    STRING_HANDLE device_and_module_path;

    if ((device_and_module_path = create_device_and_module_path(instance->iothub_host_fqdn, instance->device_id, instance->module_id)) == NULL)
    {
        result = MU_FAILURE;
        sas_token = NULL;
        LogError("Failed creating a SAS token (create_device_and_module_path() failed)");
    }
    else
    {
        IOTHUB_CREDENTIAL_TYPE cred_type = IoTHubClient_Auth_Get_Credential_Type(instance->authorization_module);
        if (cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY || cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH)
        {
            sas_token = IoTHubClient_Auth_Get_SasToken(instance->authorization_module, STRING_c_str(device_and_module_path), 0, NULL);
            if (sas_token == NULL)
            {
                LogError("failure getting sas token.");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
        else if (cred_type == IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN)
        {
            sas_token = IoTHubClient_Auth_Get_SasToken(instance->authorization_module, NULL, 0, NULL);
            if (sas_token == NULL)
            {
                LogError("Failure getting SAS token.");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
        else if (cred_type == IOTHUB_CREDENTIAL_TYPE_X509 || cred_type == IOTHUB_CREDENTIAL_TYPE_X509_ECC)
        {
            sas_token = NULL;
            result = RESULT_OK;
        }
        else
        {
            LogError("failure unknown credential type found.");
            sas_token = NULL;
            result = MU_FAILURE;
        }


        if (sas_token != NULL)
        {
            if (put_SAS_token_to_cbs(instance, device_and_module_path, sas_token) != RESULT_OK)
            {
                result = MU_FAILURE;
                LogError("Failed putting SAS token to CBS");
            }
            else
            {
                result = RESULT_OK;
            }
            free(sas_token);
        }

        STRING_delete(device_and_module_path);
    }
    return result;
}